

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O3

Gia_Man_t * Gia_ManOneHot(int nSkips,int nVars)

{
  uint iLit1;
  Gia_Obj_t *pGVar1;
  ulong uVar2;
  int iLit0;
  uint uVar3;
  int iVar4;
  uint *__ptr;
  Gia_Man_t *p;
  char *pcVar5;
  Gia_Obj_t *pGVar6;
  ulong uVar7;
  int nObjsMax;
  size_t __nmemb;
  int iVar8;
  long lVar9;
  
  uVar3 = 0x1f;
  if (nVars - 1U != 0) {
    for (; nVars - 1U >> uVar3 == 0; uVar3 = uVar3 - 1) {
    }
  }
  iVar8 = (uVar3 ^ 0xffffffe0) + 0x21;
  if ((uint)nVars < 2) {
    iVar8 = nVars;
  }
  __nmemb = (size_t)(1 << ((byte)iVar8 & 0x1f));
  __ptr = (uint *)calloc(__nmemb,4);
  nObjsMax = nSkips + 1 + nVars * 4;
  p = Gia_ManStart(nObjsMax);
  pcVar5 = (char *)malloc(7);
  builtin_strncpy(pcVar5,"onehot",7);
  p->pName = pcVar5;
  if (0 < nSkips) {
    do {
      pGVar6 = Gia_ManAppendObj(p);
      uVar7 = *(ulong *)pGVar6;
      *(ulong *)pGVar6 = uVar7 | 0x9fffffff;
      *(ulong *)pGVar6 =
           uVar7 & 0xe0000000ffffffff | 0x9fffffff | (ulong)(p->vCis->nSize & 0x1fffffff) << 0x20;
      pGVar1 = p->pObjs;
      if ((pGVar6 < pGVar1) || (pGVar1 + p->nObjs <= pGVar6)) goto LAB_001ef27a;
      Vec_IntPush(p->vCis,(int)((ulong)((long)pGVar6 - (long)pGVar1) >> 2) * -0x55555555);
      if ((pGVar6 < p->pObjs) || (p->pObjs + p->nObjs <= pGVar6)) goto LAB_001ef27a;
      nSkips = nSkips + -1;
    } while (nSkips != 0);
  }
  if (0 < nVars) {
    uVar7 = 0;
    do {
      pGVar6 = Gia_ManAppendObj(p);
      uVar2 = *(ulong *)pGVar6;
      *(ulong *)pGVar6 = uVar2 | 0x9fffffff;
      *(ulong *)pGVar6 =
           uVar2 & 0xe0000000ffffffff | 0x9fffffff | (ulong)(p->vCis->nSize & 0x1fffffff) << 0x20;
      pGVar1 = p->pObjs;
      if ((pGVar6 < pGVar1) || (pGVar1 + p->nObjs <= pGVar6)) {
LAB_001ef27a:
        __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
      }
      Vec_IntPush(p->vCis,(int)((ulong)((long)pGVar6 - (long)pGVar1) >> 2) * -0x55555555);
      pGVar1 = p->pObjs;
      if ((pGVar6 < pGVar1) || (pGVar1 + p->nObjs <= pGVar6)) goto LAB_001ef27a;
      __ptr[uVar7] = (int)((ulong)((long)pGVar6 - (long)pGVar1) >> 2) * 0x55555556;
      uVar7 = uVar7 + 1;
    } while ((uint)nVars != uVar7);
  }
  Gia_ManHashStart(p);
  if (iVar8 != 0) {
    iVar4 = 0;
    do {
      if (iVar8 != 0x1f) {
        lVar9 = 0;
        do {
          uVar3 = __ptr[lVar9];
          iLit1 = __ptr[(1 << ((byte)iVar4 & 0x1f)) + lVar9];
          iLit0 = Gia_ManHashAnd(p,uVar3,iLit1);
          if (iLit0 != 0) {
            Gia_ManAppendCo(p,iLit0);
          }
          uVar3 = Gia_ManHashOr(p,uVar3,iLit1);
          __ptr[lVar9] = uVar3;
          lVar9 = lVar9 + (2 << ((byte)iVar4 & 0x1f));
        } while (lVar9 < (long)__nmemb);
      }
      iVar4 = iVar4 + 1;
    } while (iVar4 != iVar8);
  }
  Gia_ManHashStop(p);
  if ((int)*__ptr < 0) {
    __assert_fail("Lit >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                  ,0x131,"int Abc_LitNot(int)");
  }
  Gia_ManAppendCo(p,*__ptr ^ 1);
  free(__ptr);
  if (nObjsMax < p->nObjs) {
    __assert_fail("Gia_ManObjNum(p) <= nSkips + 4 * nVars + 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaDup.c"
                  ,0xe47,"Gia_Man_t *Gia_ManOneHot(int, int)");
  }
  return p;
}

Assistant:

Gia_Man_t * Gia_ManOneHot( int nSkips, int nVars )
{
    Gia_Man_t * p;
    int i, b, Shift, iGiaLit, nLogVars = Abc_Base2Log( nVars );
    int * pTemp = ABC_CALLOC( int, (1 << nLogVars) );
    p = Gia_ManStart( nSkips + 4 * nVars + 1 );
    p->pName = Abc_UtilStrsav( "onehot" );
    for ( i = 0; i < nSkips; i++ )
        Gia_ManAppendCi( p );
    for ( i = 0; i < nVars; i++ )
        pTemp[i] = Gia_ManAppendCi( p );
    Gia_ManHashStart( p );
    for ( b = 0; b < nLogVars; b++ )
        for ( i = 0, Shift = (1<<b); i < (1 << nLogVars); i += 2*Shift )
        {
            iGiaLit = Gia_ManHashAnd( p, pTemp[i], pTemp[i + Shift] );
            if ( iGiaLit )
                Gia_ManAppendCo( p, iGiaLit );
            pTemp[i] = Gia_ManHashOr( p, pTemp[i], pTemp[i + Shift] );
        }
    Gia_ManHashStop( p );
    Gia_ManAppendCo( p, Abc_LitNot(pTemp[0]) );
    ABC_FREE( pTemp );
    assert( Gia_ManObjNum(p) <= nSkips + 4 * nVars + 1 );
    return p;
}